

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrsubstruct.cpp
# Opt level: O0

void __thiscall
TPZDohrSubstruct<std::complex<float>_>::SolveSystemPhi(TPZDohrSubstruct<std::complex<float>_> *this)

{
  int64_t iVar1;
  TPZFMatrix<std::complex<float>_> *this_00;
  complex<float> *this_01;
  long in_RDI;
  TPZFMatrix<std::complex<float>_> Lambda_star;
  TPZFMatrix<std::complex<float>_> I_lambda;
  int i;
  int ncoarse;
  TPZFMatrix<std::complex<float>_> *in_stack_fffffffffffffe90;
  complex<float> value;
  complex<float> local_148 [7];
  int64_t in_stack_fffffffffffffef0;
  int64_t in_stack_fffffffffffffef8;
  TPZFMatrix<std::complex<float>_> *in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff0c;
  TPZFMatrix<std::complex<float>_> *in_stack_ffffffffffffff10;
  TPZFMatrix<std::complex<float>_> *in_stack_ffffffffffffff18;
  TPZMatrix<std::complex<float>_> *in_stack_ffffffffffffff20;
  int64_t in_stack_ffffffffffffff38;
  int64_t in_stack_ffffffffffffff40;
  TPZFMatrix<std::complex<float>_> *in_stack_ffffffffffffff48;
  TPZDohrSubstruct<std::complex<float>_> *in_stack_ffffffffffffff80;
  int local_10;
  
  iVar1 = TPZVec<int>::NElements((TPZVec<int> *)(in_RDI + 0x490));
  this_00 = (TPZFMatrix<std::complex<float>_> *)(long)(int)iVar1;
  TPZBaseMatrix::Rows((TPZBaseMatrix *)(in_RDI + 0x228));
  value._M_value = (_ComplexT)&stack0xffffffffffffff60;
  TPZFMatrix<std::complex<float>_>::TPZFMatrix
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  TPZFMatrix<std::complex<float>_>::Zero(in_stack_fffffffffffffe90);
  for (local_10 = 0; local_10 < (int)iVar1; local_10 = local_10 + 1) {
    this_01 = TPZFMatrix<std::complex<float>_>::operator()
                        ((TPZFMatrix<std::complex<float>_> *)value._M_value,(int64_t)this_00,in_RDI)
    ;
    std::complex<float>::operator=(this_01,1.0);
  }
  TPZBaseMatrix::Rows((TPZBaseMatrix *)(in_RDI + 0x228));
  TPZFMatrix<std::complex<float>_>::TPZFMatrix
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  TPZStepSolver<std::complex<float>_>::Solve
            ((TPZStepSolver<std::complex<float>_> *)I_lambda.fWork.fStore,
             (TPZFMatrix<std::complex<float>_> *)I_lambda.fWork._vptr_TPZVec,
             (TPZFMatrix<std::complex<float>_> *)I_lambda.fPivot._48_8_,
             (TPZFMatrix<std::complex<float>_> *)I_lambda.fPivot.fExtAlloc._8_8_);
  TPZFMatrix<std::complex<float>_>::Resize
            (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  TPZMatrix<std::complex<float>_>::Multiply
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
             in_stack_ffffffffffffff0c);
  std::complex<float>::complex(local_148,-1.0,0.0);
  TPZFMatrix<std::complex<float>_>::operator*=(this_00,value);
  ComputeCoarseStiffness(in_stack_ffffffffffffff80);
  TPZFMatrix<std::complex<float>_>::~TPZFMatrix((TPZFMatrix<std::complex<float>_> *)0x1fffd5e);
  TPZFMatrix<std::complex<float>_>::~TPZFMatrix((TPZFMatrix<std::complex<float>_> *)0x1fffd6b);
  return;
}

Assistant:

void TPZDohrSubstruct<TVar>::SolveSystemPhi() {
	int ncoarse = fCoarseIndex.NElements();
	int i;
	//  I_star.Print("fIStar = ",out,EMathematicaInput);
	//  std::cout << "Nci: ";
	//  std::cout << ncoarse;// << endl;
	//  std::cout << endl;
	//Constructing I_lambda
	TPZFMatrix<TVar> I_lambda(ncoarse+fNullPivots.Rows(),ncoarse);
	I_lambda.Zero();
	for (i=0;i<ncoarse;i++) {
		I_lambda(i,i)=1;
	}
	//  I_lambda.Print("ILambda = ",out,EMathematicaInput);
	
	//Obtaining lambda_star
	TPZFMatrix<TVar> Lambda_star(ncoarse+fNullPivots.Rows(),ncoarse);
	//  temp1->Print("temp1 = ",out,EMathematicaInput);
	//  out.flush();
	finv.Solve(I_lambda, Lambda_star);
	
#ifdef PZ_LOG
	if(logger.isDebugEnabled())
	{
		std::stringstream sout;
		Lambda_star.Print("matrix lambda star",sout );
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif
	//Obtaining Phi
	/** Acho q posso comentar essas duas linhas abaixo, pq naum tou vendo aplicacao pra temp2 */
	/*
	 TPZFMatrix<TVar> temp2(fNEquations,ncoarse);
	 C_star.MultAdd(Lambda_star,Lambda_star,temp2,-1,0,1,1);
	 */
	fPhiC.Resize(fNEquations,ncoarse);
	fKeC_star.Multiply(Lambda_star,fPhiC);
	fPhiC *= -1.;
	ComputeCoarseStiffness();
	//  fPhiC.Print("PhiC = ",out,EMathematicaInput);
	//  fC.Print("Ci = ",std::cout,EMathematicaInput);
}